

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O1

void __thiscall
KDIS::UTILS::DeadReckoningCalculator::DeadReckoningCalculator(DeadReckoningCalculator *this)

{
  TMATRIX *pTVar1;
  KUINT16 i;
  long lVar2;
  KUINT16 j;
  long lVar3;
  float fVar4;
  
  DATA_TYPE::WorldCoordinates::WorldCoordinates(&this->m_initPosition);
  DATA_TYPE::Vector::Vector(&this->m_initLinearVelocity);
  DATA_TYPE::Vector::Vector(&this->m_initLinearAcceleration);
  DATA_TYPE::Vector::Vector(&this->m_Ab);
  DATA_TYPE::Vector::Vector(&this->m_quatAxis);
  this->m_f64Magnitude = 0.0;
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initOrientation);
  DATA_TYPE::EulerAngles::EulerAngles(&this->m_initEulerAngularVelocity);
  pTVar1 = &this->m_initOrientationMatrix;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      fVar4 = 1.0;
      if (lVar2 != lVar3) {
        fVar4 = 0.0;
      }
      pTVar1->Data[0][lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pTVar1 = (TMATRIX *)(pTVar1->Data + 1);
  } while (lVar2 != 3);
  pTVar1 = &this->m_initOrientationMatrixTranspose;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      fVar4 = 1.0;
      if (lVar2 != lVar3) {
        fVar4 = 0.0;
      }
      pTVar1->Data[0][lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pTVar1 = (TMATRIX *)(pTVar1->Data + 1);
  } while (lVar2 != 3);
  DATA_TYPE::Vector::Vector(&this->m_initAngularVelocity);
  pTVar1 = &this->m_wwMatrix;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      fVar4 = 1.0;
      if (lVar2 != lVar3) {
        fVar4 = 0.0;
      }
      pTVar1->Data[0][lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pTVar1 = (TMATRIX *)(pTVar1->Data + 1);
  } while (lVar2 != 3);
  pTVar1 = &this->m_SkewOmegaMatrix;
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      fVar4 = 1.0;
      if (lVar2 != lVar3) {
        fVar4 = 0.0;
      }
      pTVar1->Data[0][lVar3] = fVar4;
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pTVar1 = (TMATRIX *)(pTVar1->Data + 1);
  } while (lVar2 != 3);
  this->m_DRA = Other_DRA;
  return;
}

Assistant:

DeadReckoningCalculator::DeadReckoningCalculator() :
    m_f64Magnitude( 0 ),
    m_DRA( Other_DRA )
{
}